

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire.hpp
# Opt level: O2

string * __thiscall
wire::string::replace
          (string *__return_storage_ptr__,string *this,string *target,string *replacement)

{
  ulong uVar1;
  string s;
  string asStack_48 [32];
  
  std::__cxx11::string::string(asStack_48,(string *)this);
  while( true ) {
    uVar1 = std::__cxx11::string::find(asStack_48,(ulong)target);
    if (uVar1 == 0xffffffffffffffff) break;
    std::__cxx11::string::replace((ulong)asStack_48,uVar1,(string *)target->_M_string_length);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,asStack_48);
  std::__cxx11::string::~string(asStack_48);
  return __return_storage_ptr__;
}

Assistant:

string replace( const std::string &target, const std::string &replacement ) const
        {
            size_t found = 0;
            std::string s = *this;

            while( ( found = s.find( target, found ) ) != string::npos )
            {
                s.replace( found, target.length(), replacement );
                found += replacement.length();
            }

            return s;
        }